

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabulatedDistribution.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution::TabulatedDistribution
          (TabulatedDistribution *this,TabulatedDistribution *param_1)

{
  ListRecord::ListRecord((ListRecord *)this,(ListRecord *)param_1);
  this->lang_ = param_1->lang_;
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT TabulatedDistribution : protected Base {

  /* fields */
  int lang_;

  /* auxiliary functions */
  #include "ENDFtk/section/6/ContinuumEnergyAngle/TabulatedDistribution/src/checkLANG.hpp"
  #include "ENDFtk/section/6/ContinuumEnergyAngle/TabulatedDistribution/src/generateList.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/6/ContinuumEnergyAngle/TabulatedDistribution/src/ctor.hpp"

  /* methods */

  /**
   *  @brief Return the representation type
   */
  int LANG() const { return this->lang_; }

  /**
   *  @brief Return the representation type
   */
  int representation() const { return this->LANG(); }

  using Base::E;
  using Base::incidentEnergy;
  using Base::ND;
  using Base::numberDiscreteEnergies;
  using Base::NA;
  using Base::numberAngularParameters;
  using Base::NW;
  using Base::NEP;
  using Base::numberSecondaryEnergies;
  using Base::EP;
  using Base::energies;
  using Base::F0;
  using Base::totalEmissionProbabilities;

  /**
   *  @brief Return the cosine values
   */
  auto MU() const {

    return Base::list()
             | ranges::views::chunk( 2 + this->NA() )
             | ranges::cpp20::views::transform(
                   ranges::views::drop( 2 )
                       | ranges::views::stride( 2 ) ); }

  /**
   *  @brief Return the cosine values
   */
  auto cosines() const { return this->MU(); }

  /**
   *  @brief Return the distribution probabilities
   */
  auto F() const {

    return Base::list()
             | ranges::views::chunk( 2 + this->NA() )
             | ranges::cpp20::views::transform(
                   ranges::views::drop( 3 )
                       | ranges::views::stride( 2 ) ); }

  /**
   *  @brief Return the distribution probabilities
   */
  auto probabilities() const { return this->F(); }

  using Base::NC;
  using Base::print;
}